

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityBegin(char *filename)

{
  char *filename_local;
  
  Unity.TestFile = filename;
  Unity.CurrentTestName = (char *)0x0;
  Unity.CurrentTestLineNumber = 0;
  Unity.NumberOfTests = 0;
  Unity.TestFailures = 0;
  Unity.TestIgnores = 0;
  Unity.CurrentTestFailed = 0;
  Unity.CurrentTestIgnored = 0;
  Unity.CurrentDetail1 = (char *)0x0;
  Unity.CurrentDetail2 = (char *)0x0;
  return;
}

Assistant:

void UnityBegin(const char* filename)
{
    Unity.TestFile = filename;
    Unity.CurrentTestName = NULL;
    Unity.CurrentTestLineNumber = 0;
    Unity.NumberOfTests = 0;
    Unity.TestFailures = 0;
    Unity.TestIgnores = 0;
    Unity.CurrentTestFailed = 0;
    Unity.CurrentTestIgnored = 0;
    UNITY_EXEC_TIME_RESET();

    UNITY_CLR_DETAILS();
    UNITY_OUTPUT_START();
}